

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterOpenTempFile(sqlite3 *db,i64 nExtend,sqlite3_file **ppFd)

{
  int iVar1;
  undefined8 local_38;
  i64 max;
  sqlite3_file **ppsStack_28;
  int rc;
  sqlite3_file **ppFd_local;
  i64 nExtend_local;
  sqlite3 *db_local;
  
  ppsStack_28 = ppFd;
  ppFd_local = (sqlite3_file **)nExtend;
  nExtend_local = (i64)db;
  iVar1 = sqlite3FaultSim(0xca);
  if (iVar1 == 0) {
    max._4_4_ = sqlite3OsOpenMalloc(*(sqlite3_vfs **)nExtend_local,(char *)0x0,ppsStack_28,0x101e,
                                    (int *)((long)&max + 4));
    if (max._4_4_ == 0) {
      local_38 = 0x7fff0000;
      sqlite3OsFileControlHint(*ppsStack_28,0x12,&local_38);
      if (0 < (long)ppFd_local) {
        vdbeSorterExtendFile((sqlite3 *)nExtend_local,*ppsStack_28,(i64)ppFd_local);
      }
    }
    db_local._4_4_ = max._4_4_;
  }
  else {
    db_local._4_4_ = 0xd0a;
  }
  return db_local._4_4_;
}

Assistant:

static int vdbeSorterOpenTempFile(
  sqlite3 *db,                    /* Database handle doing sort */
  i64 nExtend,                    /* Attempt to extend file to this size */
  sqlite3_file **ppFd
){
  int rc;
  if( sqlite3FaultSim(202) ) return SQLITE_IOERR_ACCESS;
  rc = sqlite3OsOpenMalloc(db->pVfs, 0, ppFd,
      SQLITE_OPEN_TEMP_JOURNAL |
      SQLITE_OPEN_READWRITE    | SQLITE_OPEN_CREATE |
      SQLITE_OPEN_EXCLUSIVE    | SQLITE_OPEN_DELETEONCLOSE, &rc
  );
  if( rc==SQLITE_OK ){
    i64 max = SQLITE_MAX_MMAP_SIZE;
    sqlite3OsFileControlHint(*ppFd, SQLITE_FCNTL_MMAP_SIZE, (void*)&max);
    if( nExtend>0 ){
      vdbeSorterExtendFile(db, *ppFd, nExtend);
    }
  }
  return rc;
}